

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int BUFFER_pre_build(BUFFER_HANDLE handle,size_t size)

{
  LOGGER_LOG p_Var1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    iVar4 = 0x108;
  }
  else if (size == 0) {
    iVar4 = 0x10d;
  }
  else {
    if (handle->buffer == (uchar *)0x0) {
      puVar2 = (uchar *)malloc(size);
      handle->buffer = puVar2;
      if (puVar2 != (uchar *)0x0) {
        handle->size = size;
        return 0;
      }
      p_Var1 = xlogging_get_log_function();
      iVar4 = 0x11e;
      if (p_Var1 == (LOGGER_LOG)0x0) {
        return 0x11e;
      }
      pcVar5 = "Failure allocating buffer";
      iVar3 = 0x11d;
    }
    else {
      p_Var1 = xlogging_get_log_function();
      iVar4 = 0x116;
      if (p_Var1 == (LOGGER_LOG)0x0) {
        return 0x116;
      }
      pcVar5 = "Failure buffer data is NULL";
      iVar3 = 0x115;
    }
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/buffer.c"
              ,"BUFFER_pre_build",iVar3,1,pcVar5);
  }
  return iVar4;
}

Assistant:

int BUFFER_pre_build(BUFFER_HANDLE handle, size_t size)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_006: [If handle is NULL or size is 0 then BUFFER_pre_build shall return a nonzero value.] */
        result = MU_FAILURE;
    }
    else if (size == 0)
    {
        /* Codes_SRS_BUFFER_07_006: [If handle is NULL or size is 0 then BUFFER_pre_build shall return a nonzero value.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        if (b->buffer != NULL)
        {
            /* Codes_SRS_BUFFER_07_007: [BUFFER_pre_build shall return nonzero if the buffer has been previously allocated and is not NULL.] */
            LogError("Failure buffer data is NULL");
            result = MU_FAILURE;
        }
        else
        {
            if ((b->buffer = (unsigned char*)malloc(size)) == NULL)
            {
                /* Codes_SRS_BUFFER_07_013: [BUFFER_pre_build shall return nonzero if any error is encountered.] */
                LogError("Failure allocating buffer");
                result = MU_FAILURE;
            }
            else
            {
                b->size = size;
                result = 0;
            }
        }
    }
    return result;
}